

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Project
          (Relation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *expressions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *aliases)

{
  element_type *peVar1;
  type context;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar2;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  result_list;
  undefined1 local_79;
  undefined1 local_78 [24];
  element_type *peStack_60;
  enable_shared_from_this<duckdb::Relation> local_50;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_40;
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)(expressions + 1));
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_78);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)local_78);
  StringListToExpressionList
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_40,context,aliases);
  if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_50);
  local_78._0_8_ = (ProjectionRelation *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ProjectionRelation,std::allocator<duckdb::ProjectionRelation>,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::vector<std::__cxx11::string,true>const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),
             (ProjectionRelation **)local_78,(allocator<duckdb::ProjectionRelation> *)&local_79,
             (shared_ptr<duckdb::Relation,_true> *)&local_50,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_40,in_RCX);
  shared_ptr<duckdb::ProjectionRelation,_true>::shared_ptr
            ((shared_ptr<duckdb::ProjectionRelation,_true> *)(local_78 + 0x10),
             (shared_ptr<duckdb::ProjectionRelation> *)local_78);
  if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  peVar1 = peStack_60;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peStack_60 = (element_type *)0x0;
  this->_vptr_Relation = (_func_int **)local_78._16_8_;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_78._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_50.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_40);
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Project(const vector<string> &expressions, const vector<string> &aliases) {
	auto result_list = StringListToExpressionList(*context->GetContext(), expressions);
	return make_shared_ptr<ProjectionRelation>(shared_from_this(), std::move(result_list), aliases);
}